

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taylor_math.hpp
# Opt level: O2

void atan_taylor<double,6>(taylor<double,_1,_6> *t,double *a)

{
  double dVar1;
  taylor<double,_1,_6> x;
  taylor<double,_1,_6> invt;
  double local_b0;
  undefined8 local_a8;
  double dStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  taylor<double,_1,_6> local_68;
  
  local_68.super_polynomial<double,_1,_6>.c[4] = 0.0;
  local_68.super_polynomial<double,_1,_6>.c[5] = 0.0;
  local_68.super_polynomial<double,_1,_6>.c[2] = 0.0;
  local_68.super_polynomial<double,_1,_6>.c[3] = 0.0;
  local_68.super_polynomial<double,_1,_6>.c[0] = 0.0;
  local_68.super_polynomial<double,_1,_6>.c[1] = 0.0;
  local_68.super_polynomial<double,_1,_6>.c[6] = 0.0;
  local_88 = 0;
  uStack_80 = 0;
  local_78 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_a8 = 0;
  dStack_a0 = 0.0;
  local_b0 = *a * *a + 1.0;
  inv_taylor<double,6>(&local_68,&local_b0);
  local_b0 = (double)((ulong)local_b0 & 0xffffffff00000000);
  taylor<double,1,6>::operator=((taylor<double,1,6> *)&local_a8,(int *)&local_b0);
  dStack_a0 = *a + *a;
  local_98 = 0x3ff0000000000000;
  polymul_internal::composer<double,_1,_6,_6>::compose0
            ((double *)t,(double *)&local_a8,(double *)&local_68);
  taylor<double,_1,_6>::integrate(t);
  dVar1 = atan(*a);
  (t->super_polynomial<double,_1,_6>).c[0] = dVar1;
  return;
}

Assistant:

static void atan_taylor(taylor<T, 1, Ndeg> & t, const T & a) {
  // Calculate taylor expansion of 1/(1+a^2+x)
  taylor<T, 1, Ndeg> invt, x;
  inv_taylor(invt, 1 + a * a);
  // insert x = 2*a*x + x^2
  x = 0;
  if (Ndeg > 0)
    x[1] = 2 * a;
  if (Ndeg > 1)
    x[2] = 1;
  x.compose0(t, invt);
  // Integrate each term and set the constant
  t.integrate();
  t[0] = atan(a);
}